

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuX11GlxPlatform.cpp
# Opt level: O0

void __thiscall
tcu::x11::glx::GlxContextFactory::GlxContextFactory(GlxContextFactory *this,EventState *eventState)

{
  _func_void *value;
  PFNGLXCREATECONTEXTATTRIBSARBPROC p_Var1;
  allocator<char> local_71;
  string local_70;
  allocator<char> local_39;
  string local_38;
  EventState *local_18;
  EventState *eventState_local;
  GlxContextFactory *this_local;
  
  local_18 = eventState;
  eventState_local = (EventState *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"glx",&local_39);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_70,"X11 GLX OpenGL Context",&local_71);
  glu::ContextFactory::ContextFactory(&this->super_ContextFactory,&local_38,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::allocator<char>::~allocator(&local_71);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  (this->super_ContextFactory).super_FactoryBase.super_AbstractFactory._vptr_AbstractFactory =
       (_func_int **)&PTR__GlxContextFactory_032288b0;
  value = (_func_void *)glXGetProcAddress("glXCreateContextAttribsARB");
  p_Var1 = (PFNGLXCREATECONTEXTATTRIBSARBPROC)
           __tcu__x11__glx__checkGLX<void(*)()>_void______char_const__char_const__int__
                     (value,
                      "glXGetProcAddress( reinterpret_cast<const GLubyte*>(\"glXCreateContextAttribsARB\"))"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/platform/X11/tcuX11GlxPlatform.cpp"
                      ,0xcd);
  this->m_glXCreateContextAttribsARB = p_Var1;
  this->m_eventState = local_18;
  XSetErrorHandler(tcuX11GlxErrorHandler);
  return;
}

Assistant:

GlxContextFactory::GlxContextFactory (EventState& eventState)
	: glu::ContextFactory			("glx", "X11 GLX OpenGL Context")
	, m_glXCreateContextAttribsARB	(
		reinterpret_cast<PFNGLXCREATECONTEXTATTRIBSARBPROC>(
			TCU_CHECK_GLX(
				glXGetProcAddress(
					reinterpret_cast<const GLubyte*>("glXCreateContextAttribsARB")))))
	, m_eventState					(eventState)
{
	XSetErrorHandler(tcuX11GlxErrorHandler);
}